

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_mcode6(compiler_state_t *cstate,char *s1,char *s2,uint masklen,qual q)

{
  uint uVar1;
  sockaddr *psVar2;
  addrinfo *__ai;
  block *pbVar3;
  char *pcVar4;
  in6_addr mask;
  anon_union_16_3_a3f0114d_for___in6_u local_58;
  char *local_40;
  char *local_38;
  
  if (s2 == (char *)0x0) {
    __ai = pcap_nametoaddrinfo(s1);
    s2 = s1;
    if (__ai == (addrinfo *)0x0) {
      pcVar4 = "invalid ip6 address %s";
    }
    else {
      cstate->ai = __ai;
      if (__ai->ai_next == (addrinfo *)0x0) {
        local_40 = s1;
        if (0x80 < masklen) {
          bpf_error(cstate,"mask length must be <= %u",0x80);
        }
        psVar2 = __ai->ai_addr;
        local_38 = psVar2->sa_data + 6;
        local_58._0_8_ = 0;
        local_58._8_8_ = 0;
        memset(&local_58,0xff,(ulong)(masklen >> 3));
        if ((masklen & 7) != 0) {
          local_58.__u6_addr8[masklen >> 3] = (uint8_t)(0xff << (8U - (char)(masklen & 7) & 0x1f));
        }
        if (((((*(uint *)local_38 & ~local_58.__u6_addr32[0]) != 0) ||
             ((*(uint *)(psVar2->sa_data + 10) & ~local_58.__u6_addr32[1]) != 0)) ||
            (uVar1._0_2_ = psVar2[1].sa_family, uVar1._2_1_ = psVar2[1].sa_data[0],
            uVar1._3_1_ = psVar2[1].sa_data[1], (uVar1 & ~local_58.__u6_addr32[2]) != 0)) ||
           ((*(uint *)(psVar2[1].sa_data + 2) & ~local_58.__u6_addr32[3]) != 0)) {
          bpf_error(cstate,"non-network bits set in \"%s/%d\"",local_40,(ulong)masklen);
        }
        if (q.addr < 2) {
          if (masklen == 0x80) {
LAB_0010e965:
            pbVar3 = gen_host6(cstate,(in6_addr *)local_38,(in6_addr *)&local_58,(uint)q >> 8 & 0xff
                               ,(uint)q >> 0x10 & 0xff,(uint)q & 0xff);
            cstate->ai = (addrinfo *)0x0;
            freeaddrinfo((addrinfo *)__ai);
            return pbVar3;
          }
          pcVar4 = "Mask syntax for networks only";
        }
        else {
          if (((uint)q & 0xff) == 2) goto LAB_0010e965;
          pcVar4 = "invalid qualifier against IPv6 address";
        }
        bpf_error(cstate,pcVar4);
      }
      pcVar4 = "%s resolved to multiple address";
    }
  }
  else {
    pcVar4 = "no mask %s supported";
  }
  bpf_error(cstate,pcVar4,s2);
}

Assistant:

struct block *
gen_mcode6(compiler_state_t *cstate, const char *s1, const char *s2,
    unsigned int masklen, struct qual q)
{
	struct addrinfo *res;
	struct in6_addr *addr;
	struct in6_addr mask;
	struct block *b;
	u_int32_t *a, *m;

	if (s2)
		bpf_error(cstate, "no mask %s supported", s2);

	res = pcap_nametoaddrinfo(s1);
	if (!res)
		bpf_error(cstate, "invalid ip6 address %s", s1);
	cstate->ai = res;
	if (res->ai_next)
		bpf_error(cstate, "%s resolved to multiple address", s1);
	addr = &((struct sockaddr_in6 *)res->ai_addr)->sin6_addr;

	if (sizeof(mask) * 8 < masklen)
		bpf_error(cstate, "mask length must be <= %u", (unsigned int)(sizeof(mask) * 8));
	memset(&mask, 0, sizeof(mask));
	memset(&mask, 0xff, masklen / 8);
	if (masklen % 8) {
		mask.s6_addr[masklen / 8] =
			(0xff << (8 - masklen % 8)) & 0xff;
	}

	a = (u_int32_t *)addr;
	m = (u_int32_t *)&mask;
	if ((a[0] & ~m[0]) || (a[1] & ~m[1])
	 || (a[2] & ~m[2]) || (a[3] & ~m[3])) {
		bpf_error(cstate, "non-network bits set in \"%s/%d\"", s1, masklen);
	}

	switch (q.addr) {

	case Q_DEFAULT:
	case Q_HOST:
		if (masklen != 128)
			bpf_error(cstate, "Mask syntax for networks only");
		/* FALLTHROUGH */

	case Q_NET:
		b = gen_host6(cstate, addr, &mask, q.proto, q.dir, q.addr);
		cstate->ai = NULL;
		freeaddrinfo(res);
		return b;

	default:
		bpf_error(cstate, "invalid qualifier against IPv6 address");
		/* NOTREACHED */
	}
	return NULL;
}